

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall el::base::PErrorWriter::~PErrorWriter(PErrorWriter *this)

{
  int *piVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  undefined1 *this_00;
  
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__PErrorWriter_00184290;
  if ((this->super_Writer).m_proceed == true) {
    this_00 = &((this->super_Writer).m_logger)->field_0x50;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": ",2);
    piVar1 = __errno_location();
    __s = strerror(*piVar1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," [",2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)this_00,*piVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
  }
  Writer::~Writer(&this->super_Writer);
  return;
}

Assistant:

PErrorWriter::~PErrorWriter(void) {
  if (m_proceed) {
#if ELPP_COMPILER_MSVC
    char buff[256];
    strerror_s(buff, 256, errno);
    m_logger->stream() << ": " << buff << " [" << errno << "]";
#else
    m_logger->stream() << ": " << strerror(errno) << " [" << errno << "]";
#endif
  }
}